

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O3

void cast_verify::TestFloat(void)

{
  double dVar1;
  ostream *poVar2;
  uint i;
  long lVar3;
  CastTest<float> tests [5];
  CastTest<float> local_58 [6];
  
  InitializeCastArray<float>(local_58,5);
  lVar3 = 0;
  do {
    dVar1 = (double)local_58[lVar3].x;
    if (((0x7fefffffffffffff < (long)ABS(dVar1)) || (local_58[lVar3].x < 0.0)) ||
       (1.844674407370955e+19 < dVar1)) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    if (local_58[lVar3].fExpected != true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error in cast float to std::uint64_t case ",0x2a);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void TestFloat()
	{
		CastTest<float> tests[5];

		InitializeCastArray(tests, _countof(tests));

		for (unsigned i = 0; i < _countof(tests); ++i)
		{
			SafeInt<std::uint64_t> test;
			bool fSuccess;

			try
			{
				test = tests[i].x;
				fSuccess = true;
			}
			catch (...)
			{
				fSuccess = false;
			}

			if (fSuccess != tests[i].fExpected)
				std::cerr << "Error in cast float to std::uint64_t case " << i << std::endl;
		}
	}